

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s5.c
# Opt level: O0

s5_err s5_parse(s5_ctx *cx,uint8_t **data,size_t *size)

{
  byte bVar1;
  uint8_t *puVar2;
  ulong uVar3;
  size_t n;
  size_t i;
  uint8_t c;
  uint8_t *p;
  s5_err err;
  size_t *size_local;
  uint8_t **data_local;
  s5_ctx *cx_local;
  
  puVar2 = *data;
  uVar3 = *size;
  n = 0;
  do {
    if (uVar3 <= n) {
      p._4_4_ = s5_ok;
      goto LAB_00114f0e;
    }
    bVar1 = puVar2[n];
    n = n + 1;
    switch(cx->state) {
    case '\0':
      if (bVar1 != 5) {
        p._4_4_ = s5_bad_version;
        goto LAB_00114f0e;
      }
      cx->state = '\x01';
      break;
    case '\x01':
      cx->arg0 = 0;
      cx->arg1 = (uint)bVar1;
      cx->state = '\x02';
      break;
    case '\x02':
      if (cx->arg0 < cx->arg1) {
        if (bVar1 == 0) {
          cx->methods = cx->methods | 1;
        }
        else if (bVar1 == 1) {
          cx->methods = cx->methods | 2;
        }
        else if (bVar1 == 2) {
          cx->methods = cx->methods | 4;
        }
        cx->arg0 = cx->arg0 + 1;
      }
      if (cx->arg0 == cx->arg1) {
        p._4_4_ = s5_auth_select;
        goto LAB_00114f0e;
      }
      break;
    case '\x03':
      if (bVar1 != 1) {
        p._4_4_ = s5_bad_version;
        goto LAB_00114f0e;
      }
      cx->state = '\x04';
      break;
    case '\x04':
      cx->arg0 = 0;
      cx->userlen = bVar1;
      cx->state = '\x05';
      break;
    case '\x05':
      if (cx->arg0 < (uint)cx->userlen) {
        cx->username[cx->arg0] = bVar1;
        cx->arg0 = cx->arg0 + 1;
      }
      if (cx->arg0 == (uint)cx->userlen) {
        cx->username[cx->userlen] = '\0';
        cx->state = '\x06';
      }
      break;
    case '\x06':
      cx->arg0 = 0;
      cx->passlen = bVar1;
      cx->state = '\a';
      break;
    case '\a':
      if (cx->arg0 < (uint)cx->passlen) {
        cx->password[cx->arg0] = bVar1;
        cx->arg0 = cx->arg0 + 1;
      }
      if (cx->arg0 == (uint)cx->passlen) {
        cx->password[cx->passlen] = '\0';
        cx->state = '\b';
        p._4_4_ = s5_auth_verify;
LAB_00114f0e:
        *data = puVar2 + n;
        *size = uVar3 - n;
        return p._4_4_;
      }
      break;
    case '\b':
      if (bVar1 != 5) {
        p._4_4_ = s5_bad_version;
        goto LAB_00114f0e;
      }
      cx->state = '\t';
      break;
    case '\t':
      if (bVar1 == 1) {
        cx->cmd = '\0';
      }
      else {
        if (bVar1 != 3) {
          p._4_4_ = s5_bad_cmd;
          goto LAB_00114f0e;
        }
        cx->cmd = '\x02';
      }
      cx->state = '\n';
      break;
    case '\n':
      cx->state = '\v';
      break;
    case '\v':
      cx->arg0 = 0;
      if (bVar1 == 1) {
        cx->state = '\r';
        cx->atyp = '\0';
        cx->arg1 = 4;
      }
      else if (bVar1 == 3) {
        cx->state = '\f';
        cx->atyp = '\x02';
        cx->arg1 = 0;
      }
      else {
        if (bVar1 != 4) {
          p._4_4_ = s5_bad_atyp;
          goto LAB_00114f0e;
        }
        cx->state = '\r';
        cx->atyp = '\x01';
        cx->arg1 = 0x10;
      }
      break;
    case '\f':
      cx->arg1 = (uint)bVar1;
      cx->state = '\r';
      break;
    case '\r':
      if (cx->arg0 < cx->arg1) {
        cx->daddr[cx->arg0] = bVar1;
        cx->arg0 = cx->arg0 + 1;
      }
      if (cx->arg0 == cx->arg1) {
        cx->daddr[cx->arg1] = '\0';
        cx->state = '\x0e';
      }
      break;
    case '\x0e':
      cx->dport = (ushort)bVar1 << 8;
      cx->state = '\x0f';
      break;
    case '\x0f':
      cx->dport = cx->dport | (ushort)bVar1;
      cx->state = '\x10';
      p._4_4_ = s5_exec_cmd;
      goto LAB_00114f0e;
    case '\x10':
      break;
    default:
      abort();
    }
  } while( true );
}

Assistant:

s5_err s5_parse(s5_ctx *cx, uint8_t **data, size_t *size) {
  s5_err err;
  uint8_t *p;
  uint8_t c;
  size_t i;
  size_t n;

  p = *data;
  n = *size;
  i = 0;

  while (i < n) {
    c = p[i];
    i += 1;
    switch (cx->state) {
      case s5_version:
        if (c != 5) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_nmethods;
        break;

      case s5_nmethods:
        cx->arg0 = 0;
        cx->arg1 = c;  /* Number of bytes to read. */
        cx->state = s5_methods;
        break;

      case s5_methods:
        if (cx->arg0 < cx->arg1) {
          switch (c) {
            case 0:
              cx->methods |= S5_AUTH_NONE;
              break;
            case 1:
              cx->methods |= S5_AUTH_GSSAPI;
              break;
            case 2:
              cx->methods |= S5_AUTH_PASSWD;
              break;
            /* Ignore everything we don't understand. */
          }
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->arg1) {
          err = s5_auth_select;
          goto out;
        }
        break;

      case s5_auth_pw_version:
        if (c != 1) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_auth_pw_userlen;
        break;

      case s5_auth_pw_userlen:
        cx->arg0 = 0;
        cx->userlen = c;
        cx->state = s5_auth_pw_username;
        break;

      case s5_auth_pw_username:
        if (cx->arg0 < cx->userlen) {
          cx->username[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->userlen) {
          cx->username[cx->userlen] = '\0';
          cx->state = s5_auth_pw_passlen;
        }
        break;

      case s5_auth_pw_passlen:
        cx->arg0 = 0;
        cx->passlen = c;
        cx->state = s5_auth_pw_password;
        break;

      case s5_auth_pw_password:
        if (cx->arg0 < cx->passlen) {
          cx->password[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->passlen) {
          cx->password[cx->passlen] = '\0';
          cx->state = s5_req_version;
          err = s5_auth_verify;
          goto out;
        }
        break;

      case s5_req_version:
        if (c != 5) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_req_cmd;
        break;

      case s5_req_cmd:
        switch (c) {
          case 1:  /* TCP connect */
            cx->cmd = s5_cmd_tcp_connect;
            break;
          case 3:  /* UDP associate */
            cx->cmd = s5_cmd_udp_assoc;
            break;
          default:
            err = s5_bad_cmd;
            goto out;
        }
        cx->state = s5_req_reserved;
        break;

      case s5_req_reserved:
        cx->state = s5_req_atyp;
        break;

      case s5_req_atyp:
        cx->arg0 = 0;
        switch (c) {
          case 1:  /* IPv4, four octets. */
            cx->state = s5_req_daddr;
            cx->atyp = s5_atyp_ipv4;
            cx->arg1 = 4;
            break;
          case 3:  /* Hostname.  First byte is length. */
            cx->state = s5_req_atyp_host;
            cx->atyp = s5_atyp_host;
            cx->arg1 = 0;
            break;
          case 4:  /* IPv6, sixteen octets. */
            cx->state = s5_req_daddr;
            cx->atyp = s5_atyp_ipv6;
            cx->arg1 = 16;
            break;
          default:
            err = s5_bad_atyp;
            goto out;
        }
        break;

      case s5_req_atyp_host:
        cx->arg1 = c;
        cx->state = s5_req_daddr;
        break;

      case s5_req_daddr:
        if (cx->arg0 < cx->arg1) {
          cx->daddr[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->arg1) {
          cx->daddr[cx->arg1] = '\0';
          cx->state = s5_req_dport0;
        }
        break;

      case s5_req_dport0:
        cx->dport = c << 8;
        cx->state = s5_req_dport1;
        break;

      case s5_req_dport1:
        cx->dport |= c;
        cx->state = s5_dead;
        err = s5_exec_cmd;
        goto out;

      case s5_dead:
        break;

      default:
        abort();
    }
  }
  err = s5_ok;

out:
  *data = p + i;
  *size = n - i;
  return err;
}